

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O3

GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_> *
__thiscall
rapidjson::
GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
AddMember(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          *this,GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *name,
         GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
         *value,MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator)

{
  Number *pNVar1;
  uint uVar2;
  Number NVar3;
  uint uVar4;
  ulong uVar5;
  SizeType newCapacity;
  
  if ((this->data_).f.flags != 3) {
    __assert_fail("IsObject()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/PeterlitsZo[P]MessageBookCli/src/val/../../include/rapidjson/document.h"
                  ,0x557,
                  "GenericValue<Encoding, Allocator> &rapidjson::GenericValue<rapidjson::UTF8<>>::AddMember(GenericValue<Encoding, Allocator> &, GenericValue<Encoding, Allocator> &, Allocator &) [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                 );
  }
  if ((undefined1  [16])((undefined1  [16])name->data_ & (undefined1  [16])0x400000000000000) !=
      (undefined1  [16])0x0) {
    uVar4 = (this->data_).s.length;
    uVar2 = (this->data_).s.hashcode;
    if (uVar2 <= uVar4) {
      newCapacity = 0x10;
      if (uVar2 != 0) {
        newCapacity = (uVar2 + 1 >> 1) + uVar2;
      }
      MemberReserve(this,newCapacity,allocator);
      uVar4 = (this->data_).s.length;
    }
    uVar5 = (ulong)(this->data_).s.str & 0xffffffffffff;
    NVar3 = (Number)(name->data_).s.str;
    pNVar1 = (Number *)(uVar5 + (ulong)uVar4 * 0x20);
    *pNVar1 = (name->data_).n;
    pNVar1[1] = NVar3;
    (name->data_).f.flags = 0;
    NVar3 = (Number)(value->data_).s.str;
    pNVar1 = (Number *)(uVar5 + 0x10 + (ulong)(this->data_).s.length * 0x20);
    *pNVar1 = (value->data_).n;
    pNVar1[1] = NVar3;
    (value->data_).f.flags = 0;
    (this->data_).s.length = (this->data_).s.length + 1;
    return this;
  }
  __assert_fail("name.IsString()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/PeterlitsZo[P]MessageBookCli/src/val/../../include/rapidjson/document.h"
                ,0x558,
                "GenericValue<Encoding, Allocator> &rapidjson::GenericValue<rapidjson::UTF8<>>::AddMember(GenericValue<Encoding, Allocator> &, GenericValue<Encoding, Allocator> &, Allocator &) [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
               );
}

Assistant:

GenericValue& AddMember(GenericValue& name, GenericValue& value, Allocator& allocator) {
        RAPIDJSON_ASSERT(IsObject());
        RAPIDJSON_ASSERT(name.IsString());

        ObjectData& o = data_.o;
        if (o.size >= o.capacity)
            MemberReserve(o.capacity == 0 ? kDefaultObjectCapacity : (o.capacity + (o.capacity + 1) / 2), allocator);
        Member* members = GetMembersPointer();
        members[o.size].name.RawAssign(name);
        members[o.size].value.RawAssign(value);
        o.size++;
        return *this;
    }